

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

void __thiscall Clasp::ShortImplicationsGraph::ImplicationList::clear(ImplicationList *this,bool b)

{
  __pointer_type pBVar1;
  __pointer_type pBVar2;
  
  bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
            ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)this,b);
  pBVar2 = (this->learnt)._M_b._M_p;
  while (pBVar2 != (__pointer_type)0x0) {
    pBVar1 = (pBVar2->next)._M_b._M_p;
    operator_delete(pBVar2);
    pBVar2 = pBVar1;
  }
  LOCK();
  (this->learnt)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void ShortImplicationsGraph::ImplicationList::clear(bool b) {
	ImpListBase::clear(b);
	for (Block* x = learnt; x; ) {
		Block* t = x;
		x = x->next;
		delete t;
	}
	learnt = 0;
}